

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O0

void __thiscall
phpconvert::ZendParser::processFileProcedural
          (ZendParser *this,File *file,string *tmpString,string *tmpClassNameLower,
          PreparedType *preparedType,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tmpVector,stringstream *stream)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190 [32];
  string local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [16];
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  local_e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  string local_a8 [32];
  undefined1 local_88 [8];
  string alias;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tmpVector_local;
  PreparedType *preparedType_local;
  string *tmpClassNameLower_local;
  string *tmpString_local;
  File *file_local;
  ZendParser *this_local;
  
  local_38 = tmpVector;
  tmpVector_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)preparedType;
  preparedType_local = (PreparedType *)tmpClassNameLower;
  tmpClassNameLower_local = tmpString;
  tmpString_local = &file->name;
  file_local = (File *)this;
  bVar1 = isBuiltInType(this,preparedType);
  if (bVar1) {
    std::operator+(&local_58,"\\\\",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   tmpVector_local);
    std::__cxx11::string::operator=((string *)(tmpVector_local + 4),(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    bVar1 = isInMainTypes(this,(File *)tmpString_local,(PreparedType *)tmpVector_local);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)(tmpVector_local + 4),(string *)tmpVector_local);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(this->builtInTypes,(value_type *)tmpVector_local);
    }
    else {
      bVar1 = isKeyword(this,&preparedType_local->type);
      if (bVar1) {
        generateAlias((string *)local_88,this,local_38,2);
        std::__cxx11::string::string(local_a8);
        std::__cxx11::stringstream::str((string *)stream);
        std::__cxx11::string::~string(local_a8);
        std::ios::clear(stream + *(long *)(*(long *)stream + -0x18),0);
        local_c0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(local_38);
        local_d0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(local_38);
        local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator-(&local_d0,1);
        std::
        ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
        ::ostream_iterator(&local_e0,(ostream_type *)(stream + 0x10),"_");
        std::
        copy<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::ostream_iterator<std::__cxx11::string,char,std::char_traits<char>>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   local_c0,(ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
                             *)local_c8);
        std::__cxx11::stringstream::str();
        std::__cxx11::stringstream::str();
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)&local_150,(ulong)local_170);
        std::operator+(&local_130,&local_150,"_");
        std::operator+(&local_110,&local_130,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                      );
        generateNamespace(this,&local_110,tmpClassNameLower_local);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string(local_190);
        std::__cxx11::string::~string(local_170);
        std::operator+(&local_1b0,"\\",tmpClassNameLower_local);
        std::__cxx11::string::operator=((string *)(tmpVector_local + 4),(string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)local_88);
      }
      else {
        generateNamespace(this,(string *)tmpVector_local,(string *)(tmpVector_local + 4));
        std::operator+(&local_1d0,"\\",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (tmpVector_local + 4));
        std::__cxx11::string::operator=((string *)(tmpVector_local + 4),(string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
      }
    }
  }
  return;
}

Assistant:

void
    ZendParser::processFileProcedural(const BaseParser::File &file, string &tmpString, const string &tmpClassNameLower,
                                      BaseParser::PreparedType &preparedType, vector<string> &tmpVector,
                                      stringstream &stream) {
        if (isBuiltInType(preparedType)) {
            preparedType.alias = "\\\\" + preparedType.type;
        } else if (isInMainTypes(file, preparedType)) {
            preparedType.alias = preparedType.type;
            builtInTypes->insert(preparedType.type);
        } else if (isKeyword(tmpClassNameLower)) {
            string alias = generateAlias(tmpVector, 2);
            stream.str(string());
            stream.clear();
            copy(tmpVector.begin(), tmpVector.end() - 1,
                 ostream_iterator<string>(stream, DELIMETER));

            generateNamespace(
                    stream.str().substr(0, stream.str().length() - 1) + DELIMETER
                    + alias, tmpString);

            preparedType.alias = NAMESPACE_SEPARATOR + tmpString;
//				    cout <<"isKeyword alias: "<<preparedType.alias<<"\n";
        } else {
//                    cout <<"standard type alias: \n";
            generateNamespace(preparedType.type, preparedType.alias);
            preparedType.alias = NAMESPACE_SEPARATOR + preparedType.alias;
//				    cout <<preparedType.alias<<"\n";
        }
    }